

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

int __thiscall Jupiter::Socket::close(Socket *this,int __fd)

{
  Data *pDVar1;
  
  pDVar1 = this->m_data;
  if (pDVar1 != (Data *)0x0) {
    if (pDVar1->is_shutdown == false) {
      (*this->_vptr_Socket[4])(this);
      pDVar1 = this->m_data;
    }
    ::close(pDVar1->rawSock);
    pDVar1 = this->m_data;
    pDVar1->rawSock = 0;
  }
  return (int)pDVar1;
}

Assistant:

void Jupiter::Socket::close() {
	if (m_data != nullptr) {
		if (m_data->is_shutdown == false)
			this->shutdown();
#if defined _WIN32
		::closesocket(m_data->rawSock);
#else // _WIN32
		::close(m_data->rawSock);
#endif // _WIN32
		m_data->rawSock = 0;
	}
}